

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinarySearchTree.cpp
# Opt level: O1

bool __thiscall BinarySearchTree::insert(BinarySearchTree *this,Node *node,Node *newNode)

{
  byte bVar1;
  Node *pNVar2;
  bool bVar3;
  byte unaff_R15B;
  
  bVar3 = false;
  do {
    if (this->root == (Node *)0x0) {
      pNVar2 = (Node *)operator_new(0x18);
      this->root = pNVar2;
      pNVar2->value = newNode->value;
      pNVar2->leftChild = (Node *)0x0;
      pNVar2->rightChild = (Node *)0x0;
LAB_00105a8f:
      bVar1 = 1;
LAB_00105a91:
      if (bVar3) {
        bVar1 = unaff_R15B;
      }
      return (bool)(bVar1 & 1);
    }
    if (node->value == newNode->value) {
      bVar1 = 0;
      goto LAB_00105a91;
    }
    if (newNode->value < node->value) {
      pNVar2 = node->leftChild;
      if (pNVar2 == (Node *)0x0) {
        node->leftChild = newNode;
        newNode->leftChild = (Node *)0x0;
        node->leftChild->rightChild = (Node *)0x0;
        goto LAB_00105a8f;
      }
    }
    else {
      pNVar2 = node->rightChild;
      if (pNVar2 == (Node *)0x0) {
        node->rightChild = newNode;
        newNode->leftChild = (Node *)0x0;
        newNode->rightChild = (Node *)0x0;
        goto LAB_00105a8f;
      }
    }
    unaff_R15B = unaff_R15B & bVar3;
    bVar3 = true;
    node = pNVar2;
  } while( true );
}

Assistant:

bool BinarySearchTree::insert(Node *node, Node *newNode) {
    if (root == nullptr) {
        root = new Node;
        root->value = newNode->value;
        root->leftChild = nullptr;
        root->rightChild = nullptr;
        //  std::cout << "Root Node is Added" << std::endl;
        return true;
    }
    if (node->value == newNode->value) {
        //  std::cout << "Element already in the tree" << std::endl;
        return false;
    }
    if (node->value > newNode->value) {
        if (node->leftChild != nullptr) {
            insert(node->leftChild, newNode);
        } else {
            node->leftChild = newNode;
            (node->leftChild)->leftChild = nullptr;
            (node->leftChild)->rightChild = nullptr;
            //  std::cout << "Node Added To Left" << std::endl;
            return true;
        }
    } else {
        if (node->rightChild != nullptr) {
            insert(node->rightChild, newNode);
        } else {
            node->rightChild = newNode;
            (node->rightChild)->leftChild = nullptr;
            (node->rightChild)->rightChild = nullptr;
            //  std::cout << "Node Added To Right" << std::endl;
            return true;
        }
    }
    return false;
}